

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

JsonNode * jsonLookupStep(JsonParse *pParse,u32 iRoot,char *zPath,int *pApnd,char **pzErr)

{
  char *pcVar1;
  char cVar2;
  uint uVar3;
  JsonNode *pJVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  JsonNode *pJVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  u8 *puVar12;
  int iVar13;
  int iVar14;
  char *__s2;
  JsonNode *pJVar15;
  bool bVar16;
  ulong local_68;
  
  pJVar4 = pParse->aNode;
  pJVar15 = pJVar4 + iRoot;
  cVar2 = *zPath;
  if (cVar2 != '\0') {
    local_68 = (ulong)iRoot;
    while ((pJVar15->jnFlags & 8) == 0) {
      if (cVar2 == '.') {
        if (pJVar15->eType == '\a') {
          pcVar1 = zPath + 1;
          cVar2 = zPath[1];
          if (cVar2 == '\"') {
            uVar3 = 0;
            do {
              uVar10 = uVar3;
              if (pcVar1[uVar10 + 1] == '\0') goto LAB_001a0896;
              uVar3 = uVar10 + 1;
            } while (pcVar1[uVar10 + 1] != '\"');
            uVar3 = uVar10 + 2;
            __s2 = zPath + 2;
LAB_001a0712:
            do {
              uVar11 = pJVar15->n;
              iVar13 = (int)local_68;
              if (uVar11 != 0) {
                uVar5 = 1;
                do {
                  if ((pJVar15[uVar5].jnFlags & 1) == 0) {
                    if (pJVar15[uVar5].n == uVar10 + 2) {
                      puVar12 = &(pJVar15[uVar5].u.pPatch)->jnFlags;
LAB_001a0779:
                      iVar14 = strncmp((char *)puVar12,__s2,(ulong)uVar10);
                      if (iVar14 == 0) {
                        uVar10 = iVar13 + (int)uVar5 + 1;
                        zPath = pcVar1 + uVar3;
                        goto LAB_001a0801;
                      }
                    }
                  }
                  else if (pJVar15[uVar5].n == uVar10) {
                    puVar12 = (u8 *)pJVar15[uVar5].u.zJContent;
                    goto LAB_001a0779;
                  }
                  uVar9 = (int)uVar5 + 1;
                  iVar14 = 1;
                  if (5 < pJVar15[uVar9].eType) {
                    iVar14 = pJVar15[uVar9].n + 1;
                  }
                  uVar5 = (ulong)(iVar14 + uVar9);
                } while (iVar14 + uVar9 <= uVar11);
              }
              if ((pJVar15->jnFlags & 0x20) == 0) {
                if (pApnd != (int *)0x0) {
                  iVar14 = jsonParseAddNode(pParse,7,2,(char *)0x0);
                  uVar10 = jsonParseAddNode(pParse,5,uVar10,__s2);
                  pJVar4 = jsonLookupAppend(pParse,pcVar1 + uVar3,pApnd,pzErr);
                  if (pParse->oom != '\0') {
                    return (JsonNode *)0x0;
                  }
                  if (pJVar4 == (JsonNode *)0x0) {
                    return (JsonNode *)0x0;
                  }
                  pJVar15 = pParse->aNode;
                  pJVar15[local_68].u.iAppend = iVar14 - iVar13;
                  puVar12 = &pJVar15[local_68].jnFlags;
                  *puVar12 = *puVar12 | 0x20;
                  puVar12 = &pParse->aNode[uVar10].jnFlags;
                  *puVar12 = *puVar12 | 1;
                  return pJVar4;
                }
                goto LAB_001a093f;
              }
              local_68 = (ulong)(iVar13 + (pJVar15->u).iAppend);
              pJVar15 = pJVar4 + local_68;
            } while( true );
          }
          uVar5 = 0;
          while (((uVar3 = (uint)uVar5, cVar2 != '\0' && (cVar2 != '.')) && (cVar2 != '['))) {
            uVar5 = (ulong)(uVar3 + 1);
            cVar2 = pcVar1[uVar5];
          }
          __s2 = pcVar1;
          uVar10 = uVar3;
          if (uVar3 != 0) goto LAB_001a0712;
LAB_001a0896:
          *pzErr = pcVar1;
        }
        break;
      }
      if (cVar2 != '[') {
LAB_001a089e:
        *pzErr = zPath;
        break;
      }
      bVar7 = zPath[1];
      uVar5 = 1;
      if ((ulong)bVar7 - 0x3a < 0xfffffffffffffff6) {
        uVar3 = 0;
LAB_001a0503:
        if (bVar7 == 0x23) {
          pJVar8 = pJVar15;
          uVar6 = local_68;
          if (pJVar15->eType != '\x06') break;
          while( true ) {
            for (; (uint)uVar5 <= pJVar8->n; uVar5 = (ulong)((uint)uVar5 + iVar13)) {
              uVar3 = uVar3 + ((pJVar8[uVar5].jnFlags & 4) == 0);
              iVar13 = 1;
              if (5 < pJVar8[uVar5].eType) {
                iVar13 = pJVar8[uVar5].n + 1;
              }
            }
            if ((pJVar8->jnFlags & 0x20) == 0) break;
            uVar10 = (int)uVar6 + (pJVar8->u).iAppend;
            uVar5 = 1;
            pJVar8 = pJVar4 + (int)uVar10;
            uVar6 = (ulong)uVar10;
          }
          bVar7 = zPath[2];
          uVar10 = 2;
          if (bVar7 == 0x2d) {
            uVar5 = (ulong)(byte)zPath[3];
            if (uVar5 - 0x3a < 0xfffffffffffffff6) goto LAB_001a089e;
            uVar11 = 0;
            uVar6 = 3;
            do {
              uVar11 = ((int)(char)uVar5 + uVar11 * 10) - 0x30;
              uVar10 = (int)uVar6 + 1;
              uVar6 = (ulong)uVar10;
              bVar7 = zPath[uVar6];
              uVar5 = (ulong)bVar7;
            } while (0xfffffffffffffff5 < uVar5 - 0x3a);
            bVar16 = uVar3 < uVar11;
            uVar3 = uVar3 - uVar11;
            if (bVar16) break;
          }
          if (bVar7 == 0x5d) goto LAB_001a064c;
        }
        goto LAB_001a089e;
      }
      uVar3 = 0;
      uVar6 = (ulong)bVar7;
      do {
        uVar3 = ((int)(char)uVar6 + uVar3 * 10) - 0x30;
        uVar10 = (int)uVar5 + 1;
        uVar5 = (ulong)uVar10;
        uVar6 = (ulong)(byte)zPath[uVar5];
      } while (0xfffffffffffffff5 < uVar6 - 0x3a);
      if ((uVar10 < 2) || (zPath[uVar5] != 0x5d)) goto LAB_001a0503;
      if (pJVar15->eType != '\x06') break;
LAB_001a064c:
      zPath = zPath + (uVar10 + 1);
      while( true ) {
        iVar13 = (int)local_68;
        if (pJVar15->n != 0) break;
LAB_001a06af:
        if ((pJVar15->jnFlags & 0x20) == 0) {
          if (pApnd == (int *)0x0) {
            return (JsonNode *)0x0;
          }
          if (uVar3 != 0) {
            return (JsonNode *)0x0;
          }
          iVar14 = jsonParseAddNode(pParse,6,1,(char *)0x0);
          pJVar4 = jsonLookupAppend(pParse,zPath,pApnd,pzErr);
          if (pParse->oom != '\0') {
            return (JsonNode *)0x0;
          }
          if (pJVar4 == (JsonNode *)0x0) {
            return (JsonNode *)0x0;
          }
          pJVar15 = pParse->aNode;
          pJVar15[local_68].u.iAppend = iVar14 - iVar13;
          puVar12 = &pJVar15[local_68].jnFlags;
          *puVar12 = *puVar12 | 0x20;
          return pJVar4;
        }
LAB_001a06c4:
        local_68 = (ulong)(iVar13 + (pJVar15->u).iAppend);
        pJVar15 = pJVar4 + local_68;
      }
      uVar5 = 1;
      while( true ) {
        if ((uVar3 == 0) && ((pJVar15[uVar5].jnFlags & 4) == 0)) break;
        iVar14 = 1;
        if (5 < pJVar15[uVar5].eType) {
          iVar14 = pJVar15[uVar5].n + 1;
        }
        uVar3 = uVar3 + (int)(char)(((pJVar15[uVar5].jnFlags >> 2 & 1) != 0) + -1);
        uVar10 = (int)uVar5 + iVar14;
        uVar5 = (ulong)uVar10;
        if (pJVar15->n < uVar10) goto LAB_001a06af;
      }
      uVar3 = 0;
      if ((pJVar15->jnFlags & 0x20) != 0) goto LAB_001a06c4;
      uVar10 = (int)uVar5 + iVar13;
LAB_001a0801:
      local_68 = (ulong)uVar10;
      pJVar15 = pJVar4 + local_68;
      cVar2 = *zPath;
      if (cVar2 == '\0') {
        return pJVar15;
      }
    }
LAB_001a093f:
    pJVar15 = (JsonNode *)0x0;
  }
  return pJVar15;
}

Assistant:

static JsonNode *jsonLookupStep(
  JsonParse *pParse,      /* The JSON to search */
  u32 iRoot,              /* Begin the search at this node */
  const char *zPath,      /* The path to search */
  int *pApnd,             /* Append nodes to complete path if not NULL */
  const char **pzErr      /* Make *pzErr point to any syntax error in zPath */
){
  u32 i, j, nKey;
  const char *zKey;
  JsonNode *pRoot = &pParse->aNode[iRoot];
  if( zPath[0]==0 ) return pRoot;
  if( pRoot->jnFlags & JNODE_REPLACE ) return 0;
  if( zPath[0]=='.' ){
    if( pRoot->eType!=JSON_OBJECT ) return 0;
    zPath++;
    if( zPath[0]=='"' ){
      zKey = zPath + 1;
      for(i=1; zPath[i] && zPath[i]!='"'; i++){}
      nKey = i-1;
      if( zPath[i] ){
        i++;
      }else{
        *pzErr = zPath;
        return 0;
      }
      testcase( nKey==0 );
    }else{
      zKey = zPath;
      for(i=0; zPath[i] && zPath[i]!='.' && zPath[i]!='['; i++){}
      nKey = i;
      if( nKey==0 ){
        *pzErr = zPath;
        return 0;
      }
    }
    j = 1;
    for(;;){
      while( j<=pRoot->n ){
        if( jsonLabelCompare(pRoot+j, zKey, nKey) ){
          return jsonLookupStep(pParse, iRoot+j+1, &zPath[i], pApnd, pzErr);
        }
        j++;
        j += jsonNodeSize(&pRoot[j]);
      }
      if( (pRoot->jnFlags & JNODE_APPEND)==0 ) break;
      assert( pRoot->eU==2 );
      iRoot += pRoot->u.iAppend;
      pRoot = &pParse->aNode[iRoot];
      j = 1;
    }
    if( pApnd ){
      u32 iStart, iLabel;
      JsonNode *pNode;
      iStart = jsonParseAddNode(pParse, JSON_OBJECT, 2, 0);
      iLabel = jsonParseAddNode(pParse, JSON_STRING, nKey, zKey);
      zPath += i;
      pNode = jsonLookupAppend(pParse, zPath, pApnd, pzErr);
      if( pParse->oom ) return 0;
      if( pNode ){
        pRoot = &pParse->aNode[iRoot];
        assert( pRoot->eU==0 );
        pRoot->u.iAppend = iStart - iRoot;
        pRoot->jnFlags |= JNODE_APPEND;
        VVA( pRoot->eU = 2 );
        pParse->aNode[iLabel].jnFlags |= JNODE_RAW;
      }
      return pNode;
    }
  }else if( zPath[0]=='[' ){
    i = 0;
    j = 1;
    while( sqlite3Isdigit(zPath[j]) ){
      i = i*10 + zPath[j] - '0';
      j++;
    }
    if( j<2 || zPath[j]!=']' ){
      if( zPath[1]=='#' ){
        JsonNode *pBase = pRoot;
        int iBase = iRoot;
        if( pRoot->eType!=JSON_ARRAY ) return 0;
        for(;;){
          while( j<=pBase->n ){
            if( (pBase[j].jnFlags & JNODE_REMOVE)==0 ) i++;
            j += jsonNodeSize(&pBase[j]);
          }
          if( (pBase->jnFlags & JNODE_APPEND)==0 ) break;
          assert( pBase->eU==2 );
          iBase += pBase->u.iAppend;
          pBase = &pParse->aNode[iBase];
          j = 1;
        }
        j = 2;
        if( zPath[2]=='-' && sqlite3Isdigit(zPath[3]) ){
          unsigned int x = 0;
          j = 3;
          do{
            x = x*10 + zPath[j] - '0';
            j++;
          }while( sqlite3Isdigit(zPath[j]) );
          if( x>i ) return 0;
          i -= x;
        }
        if( zPath[j]!=']' ){
          *pzErr = zPath;
          return 0;
        }
      }else{
        *pzErr = zPath;
        return 0;
      }
    }
    if( pRoot->eType!=JSON_ARRAY ) return 0;
    zPath += j + 1;
    j = 1;
    for(;;){
      while( j<=pRoot->n && (i>0 || (pRoot[j].jnFlags & JNODE_REMOVE)!=0) ){
        if( (pRoot[j].jnFlags & JNODE_REMOVE)==0 ) i--;
        j += jsonNodeSize(&pRoot[j]);
      }
      if( (pRoot->jnFlags & JNODE_APPEND)==0 ) break;
      assert( pRoot->eU==2 );
      iRoot += pRoot->u.iAppend;
      pRoot = &pParse->aNode[iRoot];
      j = 1;
    }
    if( j<=pRoot->n ){
      return jsonLookupStep(pParse, iRoot+j, zPath, pApnd, pzErr);
    }
    if( i==0 && pApnd ){
      u32 iStart;
      JsonNode *pNode;
      iStart = jsonParseAddNode(pParse, JSON_ARRAY, 1, 0);
      pNode = jsonLookupAppend(pParse, zPath, pApnd, pzErr);
      if( pParse->oom ) return 0;
      if( pNode ){
        pRoot = &pParse->aNode[iRoot];
        assert( pRoot->eU==0 );
        pRoot->u.iAppend = iStart - iRoot;
        pRoot->jnFlags |= JNODE_APPEND;
        VVA( pRoot->eU = 2 );
      }
      return pNode;
    }
  }else{
    *pzErr = zPath;
  }
  return 0;
}